

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

void Abc_NtkInvertConstraints(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pObj_00;
  undefined4 local_1c;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkConstrNum(pNtk);
  if (iVar1 != 0) {
    for (local_1c = 0; iVar1 = Abc_NtkPoNum(pNtk), local_1c < iVar1; local_1c = local_1c + 1) {
      pObj_00 = Abc_NtkPo(pNtk,local_1c);
      iVar1 = Abc_NtkPoNum(pNtk);
      iVar2 = Abc_NtkConstrNum(pNtk);
      if (iVar1 - iVar2 <= local_1c) {
        Abc_ObjXorFaninC(pObj_00,0);
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkInvertConstraints( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    if ( Abc_NtkConstrNum(pNtk) == 0 )
        return;
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if ( i >= Abc_NtkPoNum(pNtk) - Abc_NtkConstrNum(pNtk) )
            Abc_ObjXorFaninC( pObj, 0 );
    }
}